

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O0

bool __thiscall
QNetworkCookieJar::validateCookie(QNetworkCookieJar *this,QNetworkCookie *cookie,QUrl *url)

{
  QStringView reference;
  QStringView domain_00;
  QStringView domain_01;
  QStringView domain_02;
  bool bVar1;
  QString *in_RDX;
  qsizetype in_RSI;
  storage_type_conflict *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  QString host;
  QStringView domain;
  QString cookieDomain;
  undefined4 in_stack_fffffffffffffef8;
  ComponentFormattingOption in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QString *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QString *pQVar3;
  QChar c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  byte bVar4;
  storage_type_conflict *in_stack_ffffffffffffff38;
  qsizetype local_a8;
  storage_type_conflict *in_stack_ffffffffffffff60;
  storage_type_conflict *in_stack_ffffffffffffff68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  qsizetype local_30;
  storage_type_conflict *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QNetworkCookie::domain((QNetworkCookie *)in_stack_ffffffffffffff08);
  local_30 = -0x5555555555555556;
  local_28 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  pQVar3 = in_RDX;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
            );
  c.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
  QUrl::host((QFlags_conflict *)&local_48);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDX);
  domain_00.m_size._7_1_ = in_stack_ffffffffffffff37;
  domain_00.m_size._0_7_ = in_stack_ffffffffffffff30;
  domain_00.m_data = in_stack_ffffffffffffff38;
  QVar2.m_data = in_RDI;
  QVar2.m_size = in_RSI;
  bVar1 = isParentDomain(domain_00,QVar2);
  if (!bVar1) {
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDX);
    domain_01.m_size._7_1_ = in_stack_ffffffffffffff37;
    domain_01.m_size._0_7_ = in_stack_ffffffffffffff30;
    domain_01.m_data = in_stack_ffffffffffffff38;
    reference.m_data = in_RDI;
    reference.m_size = in_RSI;
    bVar1 = isParentDomain(domain_01,reference);
    if (!bVar1) {
      bVar4 = 0;
      goto LAB_001c12c6;
    }
  }
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff6e,L'.');
  bVar1 = QStringView::startsWith
                    ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),c)
  ;
  if (bVar1) {
    QVar2 = QStringView::sliced((QStringView *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (qsizetype)in_RDX);
    local_a8 = QVar2.m_size;
    in_stack_ffffffffffffff60 = QVar2.m_data;
    local_30 = local_a8;
    local_28 = in_stack_ffffffffffffff60;
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDX);
  bVar1 = ::operator==((QStringView *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (QStringView *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  if (bVar1) {
    bVar4 = 1;
  }
  else {
    domain_02.m_data = in_stack_ffffffffffffff68;
    domain_02.m_size = (qsizetype)in_stack_ffffffffffffff60;
    bVar1 = qIsEffectiveTLD(domain_02);
    bVar4 = (bVar1 ^ 0xffU) & 1;
  }
LAB_001c12c6:
  QString::~QString((QString *)0x1c12d3);
  QString::~QString((QString *)0x1c12e0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QNetworkCookieJar::validateCookie(const QNetworkCookie &cookie, const QUrl &url) const
{
    const QString cookieDomain = cookie.domain();
    QStringView domain = cookieDomain;
    const QString host = url.host();
    if (!isParentDomain(domain, host) && !isParentDomain(host, domain))
        return false; // not accepted

    if (domain.startsWith(u'.'))
        domain = domain.sliced(1);

    // We shouldn't reject if:
    // "[...] the domain-attribute is identical to the canonicalized request-host"
    // https://tools.ietf.org/html/rfc6265#section-5.3 step 5
    if (host == domain)
        return true;
    // the check for effective TLDs makes the "embedded dot" rule from RFC 2109 section 4.3.2
    // redundant; the "leading dot" rule has been relaxed anyway, see QNetworkCookie::normalize()
    // we remove the leading dot for this check if it's present
    // Normally defined in qtldurl_p.h, but uses fall-back in this file when topleveldomain isn't
    // configured:
    return !qIsEffectiveTLD(domain);
}